

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stopwatch.h
# Opt level: O2

double StopwatchReadAndReset(Stopwatch *watch)

{
  long lVar1;
  long lVar2;
  
  lVar1 = watch->tv_sec;
  lVar2 = watch->tv_usec;
  gettimeofday((timeval *)watch,(__timezone_ptr_t)0x0);
  return ((double)watch->tv_usec - (double)lVar2) / 1000000.0 +
         ((double)watch->tv_sec - (double)lVar1);
}

Assistant:

static WEBP_INLINE double StopwatchReadAndReset(Stopwatch* watch) {
  struct timeval old_value;
  double delta_sec, delta_usec;
  memcpy(&old_value, watch, sizeof(old_value));
  gettimeofday(watch, NULL);
  delta_sec = (double)watch->tv_sec - old_value.tv_sec;
  delta_usec = (double)watch->tv_usec - old_value.tv_usec;
  return delta_sec + delta_usec / 1000000.0;
}